

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

size_t __thiscall Assimp::CFIReaderImpl::parseInt2(CFIReaderImpl *this)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  DeadlyImportError *this_00;
  
  pbVar3 = this->dataP;
  pbVar1 = pbVar3 + 1;
  this->dataP = pbVar1;
  bVar2 = *pbVar3;
  uVar4 = (uint)bVar2;
  if ((bVar2 & 0x40) == 0) {
    uVar4 = uVar4 & 0x3f;
  }
  else if ((bVar2 & 0x60) == 0x40) {
    if ((long)this->dataEnd - (long)pbVar1 < 1) {
LAB_005399d9:
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    this->dataP = pbVar3 + 2;
    uVar4 = (uVar4 & 0x1f) * 0x100 + (uint)pbVar3[1] + 0x40;
  }
  else {
    if (((bVar2 & 0x70) != 0x60) || ((long)this->dataEnd - (long)pbVar1 < 2)) goto LAB_005399d9;
    uVar4 = (uint)pbVar3[1] * 0x100 + ((uint)pbVar3[2] | (uVar4 & 0xf) << 0x10) + 0x2040;
    this->dataP = pbVar3 + 3;
  }
  return (ulong)uVar4;
}

Assistant:

size_t parseInt2() { // C.25
        uint8_t b = *dataP++;
        if (!(b & 0x40)) { // x0...... (C.25.2)
            return b & 0x3f;
        }
        else if ((b & 0x60) == 0x40) { // x10..... ........ (C.25.3)
            if (dataEnd - dataP > 0) {
                return (((b & 0x1f) << 8) | *dataP++) + 0x40;
            }
        }
        else if ((b & 0x70) == 0x60) { // x110.... ........ ........ (C.25.4)
            if (dataEnd - dataP > 1) {
                size_t result = (((b & 0x0f) << 16) | (dataP[0] << 8) | dataP[1]) + 0x2040;
                dataP += 2;
                return result;
            }
        }
        throw DeadlyImportError(parseErrorMessage);
    }